

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImStb::is_word_boundary_from_right(ImGuiInputTextState *obj,int idx)

{
  bool bVar1;
  unsigned_short *puVar2;
  uint local_24;
  byte local_1d;
  int idx_local;
  ImGuiInputTextState *obj_local;
  
  if ((obj->Flags & 0x8000U) == 0) {
    if (idx < 1) {
      local_24 = 1;
    }
    else {
      puVar2 = ImVector<unsigned_short>::operator[](&obj->TextW,idx + -1);
      bVar1 = is_separator((uint)*puVar2);
      local_1d = 0;
      if (bVar1) {
        puVar2 = ImVector<unsigned_short>::operator[](&obj->TextW,idx);
        bVar1 = is_separator((uint)*puVar2);
        local_1d = bVar1 ^ 0xff;
      }
      local_24 = (uint)(local_1d & 1);
    }
    obj_local._4_4_ = local_24;
  }
  else {
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

static int  is_word_boundary_from_right(ImGuiInputTextState* obj, int idx)      { if (obj->Flags & ImGuiInputTextFlags_Password) return 0; return idx > 0 ? (is_separator(obj->TextW[idx - 1]) && !is_separator(obj->TextW[idx]) ) : 1; }